

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomTwoAction.cpp
# Opt level: O0

ActionResults * __thiscall WhiteRoomTwoAction::Rest(WhiteRoomTwoAction *this)

{
  itemLocation iVar1;
  ActionResults *pAVar2;
  ItemWrapper *this_00;
  allocator local_a1;
  string local_a0 [38];
  undefined1 local_7a;
  allocator local_79;
  string local_78 [36];
  itemType local_54;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  WhiteRoomTwoAction *local_18;
  WhiteRoomTwoAction *this_local;
  
  local_18 = this;
  if ((this->roomLit & 1U) == 0) {
    local_54 = POWER_CRYSTAL;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_54);
    iVar1 = ItemWrapper::getLocation(this_00);
    if (iVar1 == W_ROOM2) {
      pAVar2 = (ActionResults *)operator_new(0x30);
      local_7a = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_78,
                 "As you sit down, something pokes you in the rumpus. It feels like a crystal.",
                 &local_79);
      ActionResults::ActionResults(pAVar2,CURRENT,(string *)local_78);
      local_7a = 0;
      this_local = (WhiteRoomTwoAction *)pAVar2;
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    else {
      pAVar2 = (ActionResults *)operator_new(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a0,
                 "You and Bruce Wayne have something in common. You both like hanging out in the dark."
                 ,&local_a1);
      ActionResults::ActionResults(pAVar2,CURRENT,(string *)local_a0);
      this_local = (WhiteRoomTwoAction *)pAVar2;
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
  }
  else {
    pAVar2 = (ActionResults *)operator_new(0x30);
    local_4d = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "After sitting down, you begin to realize that this room reminds you of your last 80\'s disco party. "
               ,&local_39);
    ActionResults::ActionResults(pAVar2,CURRENT,(string *)local_38);
    local_4d = 0;
    this_local = (WhiteRoomTwoAction *)pAVar2;
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return (ActionResults *)this_local;
}

Assistant:

ActionResults *WhiteRoomTwoAction::Rest() {
    if(roomLit){
        return new ActionResults(CURRENT, "After sitting down, you begin to realize that this room reminds you of your last 80's disco party. ");
    }
    else if(itemList->getValue(POWER_CRYSTAL)->getLocation() == W_ROOM2) {
        return new ActionResults(CURRENT, "As you sit down, something pokes you in the rumpus. It feels like a crystal.");
    }
    else {
        return new ActionResults(CURRENT, "You and Bruce Wayne have something in common. You both like hanging out in the dark.");
    }
}